

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O3

bool window_is_color_proc(Am_Object *self)

{
  Am_Value *this;
  Am_Ptr pvVar1;
  bool bVar2;
  
  this = Am_Object::Get(self,0x7d2,0);
  pvVar1 = Am_Value::operator_cast_to_void_(this);
  if (pvVar1 == (Am_Ptr)0x0) {
    bVar2 = true;
  }
  else {
    bVar2 = *(int *)((long)pvVar1 + 0x54) != 1;
  }
  return bVar2;
}

Assistant:

Am_Define_Formula(bool, window_is_color)
{
  Am_Drawonable *d = Am_Drawonable::Narrow(self.Get(Am_DRAWONABLE));
  // is there a better way to determine if d is valid?
  if (d)
    return d->Is_Color();
  else
    return true;
}